

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O1

bool bssl::parse_ech_config
               (CBS *cbs,ECHConfig *out,bool *out_supported,bool all_extensions_mandatory)

{
  uint8_t *__src;
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  undefined7 in_register_00000009;
  size_t extraout_RDX;
  ptrdiff_t _Num;
  size_t sVar4;
  byte bVar5;
  Span<const_unsigned_char> public_name_00;
  uint16_t type;
  uint16_t version;
  CBS contents;
  CBS public_name;
  CBS extensions;
  CBS cipher_suites;
  CBS public_key;
  CBS ech_config;
  CBS body;
  uint16_t local_ac;
  uint16_t local_aa;
  CBS local_a8;
  undefined4 local_94;
  CBS local_90;
  CBS local_80;
  CBS local_70;
  CBS local_60;
  CBS local_50;
  CBS local_40;
  
  __src = cbs->data;
  sVar4 = cbs->len;
  iVar3 = CBS_get_u16(cbs,&local_aa);
  if ((iVar3 == 0) || (iVar3 = CBS_get_u16_length_prefixed(cbs,&local_a8), iVar3 == 0)) {
    iVar3 = 0x1a6;
LAB_00133032:
    bVar2 = false;
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                  ,iVar3);
  }
  else {
    if (local_aa == 0xfe0d) {
      local_94 = (undefined4)CONCAT71(in_register_00000009,all_extensions_mandatory);
      sVar4 = sVar4 - cbs->len;
      bVar2 = Array<unsigned_char>::InitUninitialized(&out->raw,sVar4);
      if (bVar2 && sVar4 != 0) {
        memmove((out->raw).data_,__src,sVar4);
      }
      if (!bVar2) {
        return false;
      }
      local_50.data = (out->raw).data_;
      local_50.len = (out->raw).size_;
      iVar3 = CBS_skip(&local_50,2);
      if ((((((iVar3 == 0) || (iVar3 = CBS_get_u16_length_prefixed(&local_50,&local_a8), iVar3 == 0)
             ) || (iVar3 = CBS_get_u8(&local_a8,&out->config_id), iVar3 == 0)) ||
           (((iVar3 = CBS_get_u16(&local_a8,&out->kem_id), iVar3 == 0 ||
             (iVar3 = CBS_get_u16_length_prefixed(&local_a8,&local_60), iVar3 == 0)) ||
            ((local_60.len == 0 ||
             ((iVar3 = CBS_get_u16_length_prefixed(&local_a8,&local_70), iVar3 == 0 ||
              ((local_70.len & 3) != 0 || local_70.len == 0)))))))) ||
          (iVar3 = CBS_get_u8(&local_a8,&out->maximum_name_length), iVar3 == 0)) ||
         ((((iVar3 = CBS_get_u8_length_prefixed(&local_a8,&local_90), iVar3 == 0 ||
            ((uchar *)local_90.len == (uchar *)0x0)) ||
           (iVar3 = CBS_get_u16_length_prefixed(&local_a8,&local_80), iVar3 == 0)) ||
          (local_a8.len != 0)))) {
        iVar3 = 0x1c5;
        goto LAB_00133032;
      }
      public_name_00.size_ = extraout_RDX;
      public_name_00.data_ = (uchar *)local_90.len;
      bVar2 = ssl_is_valid_ech_public_name((bssl *)local_90.data,public_name_00);
      uVar1 = local_94;
      if (!bVar2) goto LAB_00133039;
      (out->public_key).data_ = local_60.data;
      (out->public_key).size_ = local_60.len;
      (out->public_name).data_ = local_90.data;
      (out->public_name).size_ = local_90.len;
      (out->cipher_suites).data_ = local_70.data;
      (out->cipher_suites).size_ = local_70.len;
      bVar5 = 0;
      while (local_80.len != 0) {
        iVar3 = CBS_get_u16(&local_80,&local_ac);
        if ((iVar3 == 0) || (iVar3 = CBS_get_u16_length_prefixed(&local_80,&local_40), iVar3 == 0))
        {
          bVar2 = false;
          ERR_put_error(0x10,0,0x89,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/encrypted_client_hello.cc"
                        ,0x1dd);
        }
        else {
          if ((char)uVar1 != '\0') {
            bVar5 = 1;
          }
          if ((short)local_ac < 0) {
            bVar5 = 1;
          }
          bVar2 = true;
        }
        if (!bVar2) {
          return false;
        }
      }
      *out_supported = (bool)(~bVar5 & 1);
    }
    else {
LAB_00133039:
      *out_supported = false;
    }
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

static bool parse_ech_config(CBS *cbs, ECHConfig *out, bool *out_supported,
                             bool all_extensions_mandatory) {
  uint16_t version;
  CBS orig = *cbs;
  CBS contents;
  if (!CBS_get_u16(cbs, &version) ||
      !CBS_get_u16_length_prefixed(cbs, &contents)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  if (version != kECHConfigVersion) {
    *out_supported = false;
    return true;
  }

  // Make a copy of the ECHConfig and parse from it, so the results alias into
  // the saved copy.
  if (!out->raw.CopyFrom(
          Span(CBS_data(&orig), CBS_len(&orig) - CBS_len(cbs)))) {
    return false;
  }

  CBS ech_config(out->raw);
  CBS public_name, public_key, cipher_suites, extensions;
  if (!CBS_skip(&ech_config, 2) ||  // version
      !CBS_get_u16_length_prefixed(&ech_config, &contents) ||
      !CBS_get_u8(&contents, &out->config_id) ||
      !CBS_get_u16(&contents, &out->kem_id) ||
      !CBS_get_u16_length_prefixed(&contents, &public_key) ||
      CBS_len(&public_key) == 0 ||
      !CBS_get_u16_length_prefixed(&contents, &cipher_suites) ||
      CBS_len(&cipher_suites) == 0 || CBS_len(&cipher_suites) % 4 != 0 ||
      !CBS_get_u8(&contents, &out->maximum_name_length) ||
      !CBS_get_u8_length_prefixed(&contents, &public_name) ||
      CBS_len(&public_name) == 0 ||
      !CBS_get_u16_length_prefixed(&contents, &extensions) ||
      CBS_len(&contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  if (!ssl_is_valid_ech_public_name(public_name)) {
    // TODO(https://crbug.com/boringssl/275): The draft says ECHConfigs with
    // invalid public names should be ignored, but LDH syntax failures are
    // unambiguously invalid.
    *out_supported = false;
    return true;
  }

  out->public_key = public_key;
  out->public_name = public_name;
  // This function does not ensure |out->kem_id| and |out->cipher_suites| use
  // supported algorithms. The caller must do this.
  out->cipher_suites = cipher_suites;

  bool has_unknown_mandatory_extension = false;
  while (CBS_len(&extensions) != 0) {
    uint16_t type;
    CBS body;
    if (!CBS_get_u16(&extensions, &type) ||
        !CBS_get_u16_length_prefixed(&extensions, &body)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return false;
    }
    // We currently do not support any extensions.
    if (type & 0x8000 || all_extensions_mandatory) {
      // Extension numbers with the high bit set are mandatory. Continue parsing
      // to enforce syntax, but we will ultimately ignore this ECHConfig as a
      // client and reject it as a server.
      has_unknown_mandatory_extension = true;
    }
  }

  *out_supported = !has_unknown_mandatory_extension;
  return true;
}